

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::CMP(CPU *this,uint8_t reg,uint8_t argument)

{
  uint16_t result;
  uint8_t argument_local;
  uint8_t reg_local;
  CPU *this_local;
  
  if ((ushort)((ushort)reg - (ushort)argument) < 0x100) {
    this->field_0x2e = this->field_0x2e & 0x7f | 0x80;
  }
  else {
    this->field_0x2e = this->field_0x2e & 0x7f;
  }
  if (((ushort)reg - (ushort)argument & 0x80) == 0) {
    this->field_0x2e = this->field_0x2e & 0xfe;
  }
  else {
    this->field_0x2e = this->field_0x2e & 0xfe | 1;
  }
  if (reg == argument) {
    this->field_0x2e = this->field_0x2e & 0xbf | 0x40;
  }
  else {
    this->field_0x2e = this->field_0x2e & 0xbf;
  }
  return;
}

Assistant:

void CPU::CMP(uint8_t reg, uint8_t argument) { // CMP, CPY, CPX
	uint16_t result = uint16_t(reg) - argument;
	if (result < 0x100) {
		C = 1;
	} else {
		C = 0;
	}
	if (result & (1 << 7)) {
		N = 1;
	} else {
		N = 0;
	}
	if (reg == argument) {
		Z = 1;
	} else {
		Z = 0;
	}
}